

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coba.cpp
# Opt level: O2

void fun1(int px,int py)

{
  bool bVar1;
  int y;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  uVar3 = 100;
  for (uVar2 = 0; uVar2 != 900; uVar2 = uVar2 + 1) {
    y = py + uVar3;
    bVar5 = uVar3 - 100 < 0xb;
    uVar4 = 100;
    while( true ) {
      if (uVar4 == 1000) break;
      if (uVar4 - 0xa0 < 0xb && uVar3 < 0xa1) {
        setWarna(px + uVar4,y);
      }
      if (uVar4 - 0xa0 < 0x29 && (uVar3 - 0x78 < 0xb || bVar5)) {
        setWarna(px + uVar4,y);
      }
      if ((uVar3 < 0xa1 && uVar4 - 0xbe < 0xb) || (uVar4 < 0x97 && (uVar3 - 0x96 < 0xb || bVar5))) {
        setWarna(px + uVar4,y);
      }
      if (((int)(0x95 - uVar2) <= (int)uVar4) &&
         (((int)uVar4 <= (int)(0x9f - uVar2) && 0x6d < uVar3) && uVar2 < 0x31)) {
        setWarna(px + uVar4,y);
      }
      if (uVar4 - 0xd2 < 0xb && uVar3 < 0xa1) {
        setWarna(px + uVar4,y);
      }
      if (((uVar2 + 0xd3 <= uVar4) && (uVar2 < 0x31)) && (uVar4 <= uVar2 + 0xdd)) {
        setWarna(px + uVar4,y);
      }
      bVar6 = uVar4 - 0x104 < 0xb;
      if ((bVar6 && uVar3 < 0xa1) || (uVar4 - 0x118 < 0xb && uVar3 < 0xa1)) {
        bVar6 = !bVar6 || uVar3 >= 0xa1;
        setWarna(px + uVar4,y);
      }
      else {
        bVar6 = false;
      }
      bVar7 = uVar2 + 0x119 <= uVar4;
      bVar1 = uVar4 <= uVar2 + 0x123;
      if ((bVar7 && uVar2 < 0x1d) && bVar1) {
        setWarna(px + uVar4,y);
      }
      if ((((int)(0x153 - uVar2) <= (int)uVar4) && (0x81 < uVar3)) &&
         ((uVar2 < 0x3b && ((int)uVar4 <= (int)(0x15d - uVar2))))) {
        setWarna(px + uVar4,y);
      }
      if (bVar6) {
        setWarna(px + uVar4,y);
      }
      if ((bVar7 && uVar2 < 0x1d) && bVar1) {
        setWarna(px + uVar4,y);
      }
      if (((((int)(0x153 - uVar2) <= (int)uVar4) && (0x81 < uVar3)) && (uVar2 < 0x3b)) &&
         ((int)uVar4 <= (int)(0x15d - uVar2))) {
        setWarna(px + uVar4,y);
      }
      if (uVar4 - 0x14a < 0xb && uVar3 < 0xa1) {
        setWarna(px + uVar4,y);
      }
      uVar4 = uVar4 + 1;
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void fun1(int px, int py) {
	int i = 0, x, y;
  // Figure out where in memory to put the pixel
  for (y = 100; y < 1000; y++) {
	  i++;
    for (x = 100; x < 1000; x++) {
      if(x>=160&&x<=170&&y<=160){
				setWarna(px+x,py+y);
			}
			if(y>=100&&y<=110&&x>=160&&x<=200){
				setWarna(px+x,py+y);
			}
			if(y>=120&&y<=130&&x>=160&&x<=200){
				setWarna(px+x,py+y);
			}
			if(x>=190&&x<=200&y<=160){
				setWarna(px+x,py+y);
			}
			if(y>=100&&y<=110&&x<=150){
					setWarna(px+x,py+y);
				}
			if(y>=150&&y<=160&&x<=150){
					setWarna(px+x,py+y);
				}
			if(x>=150-i&&x<=160-i&&i<50&&y>=110){
				  setWarna(px+x,py+y);
			}
			if(x>=210&&x<=220&&y<=160){
                setWarna(px+x,py+y);
				}
				
				if(x>=210+i&&x<=220+i&&i<50){
                setWarna(px+x,py+y);
				}

				if(x>=260&&x<=270&y<=160){
                setWarna(px+x,py+y);
				}	
			if(x>=280&&x<=290&&y<=160){
                setWarna(px+x,py+y);
			}
			if(x>=280+i&&x<=290+i&&i<30){
                setWarna(px+x,py+y);
			}
			if(x>=310-(i-30)&&x<=320-(i-30)&&i<60&&y>=130){
                setWarna(px+x,py+y);
			}
			if(x>=280&&x<=290&&y<=160){
                setWarna(px+x,py+y);
			}
			if(x>=280+i&&x<=290+i&&i<30){
                setWarna(px+x,py+y);
			}
			if(x>=310-(i-30)&&x<=320-(i-30)&&i<60&&y>=130){
                setWarna(px+x,py+y);
			}
			if(x>=330&&x<=340&&y<=160){
                setWarna(px+x,py+y);
				}
    }
  }
}